

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NativeEntryPointData.cpp
# Opt level: O0

void __thiscall OOPNativeEntryPointData::OnCleanup(OOPNativeEntryPointData *this)

{
  code *pcVar1;
  bool bVar2;
  JITManager *this_00;
  undefined4 *puVar3;
  OOPNativeEntryPointData *this_local;
  
  this_00 = JITManager::GetJITManager();
  bVar2 = JITManager::IsOOPJITEnabled(this_00);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/NativeEntryPointData.cpp"
                       ,599,"(JITManager::GetJITManager()->IsOOPJITEnabled())",
                       "JITManager::GetJITManager()->IsOOPJITEnabled()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (this->nativeDataBuffer != (Type)0x0) {
    DeleteNativeDataBuffer(this->nativeDataBuffer);
    this->nativeDataBuffer = (Type)0x0;
  }
  return;
}

Assistant:

void
OOPNativeEntryPointData::OnCleanup()
{
    Assert(JITManager::GetJITManager()->IsOOPJITEnabled());
    if (this->nativeDataBuffer)
    {
        DeleteNativeDataBuffer(this->nativeDataBuffer);
        this->nativeDataBuffer = nullptr;
    }

#if !FLOATVAR
    this->numberArray = nullptr;
#endif
}